

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGParseManager.cpp
# Opt level: O3

void __thiscall BGParseWorkItem::WaitForCompletion(BGParseWorkItem *this)

{
  uint uVar1;
  bool bVar2;
  DWORD DVar3;
  Tick local_30;
  Tick now;
  
  if (this->complete != (Event *)0x0) {
    bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015b6718,BgParsePhase);
    if (bVar2) {
      local_30 = Js::Tick::Now();
      uVar1 = this->cookie;
      DVar3 = GetCurrentThreadId();
      Js::Tick::ToMilliseconds(&local_30);
      Output::Print(L"[BgParse: Wait -- cookie: %04d on thread 0x%X at %.2f ms]\n",(ulong)uVar1,
                    (ulong)DVar3);
    }
    Event::Wait(this->complete,0xffffffff);
  }
  return;
}

Assistant:

void BGParseWorkItem::WaitForCompletion()
{
    if (this->complete != nullptr)
    {
        if (PHASE_TRACE1(Js::BgParsePhase))
        {
            Js::Tick now = Js::Tick::Now();
            Output::Print(
                _u("[BgParse: Wait -- cookie: %04d on thread 0x%X at %.2f ms]\n"),
                GetCookie(),
                ::GetCurrentThreadId(),
                now.ToMilliseconds()
            );
        }

        this->complete->Wait();
    }
}